

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_run_container_andnot
               (array_container_t *src_1,run_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  uint uVar2;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int i;
  int dest_card;
  uint16_t val;
  int which_run;
  int32_t run_end;
  int32_t run_start;
  int local_30;
  int local_2c;
  undefined2 in_stack_ffffffffffffffda;
  int32_t in_stack_ffffffffffffffdc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar4;
  
  if (in_RDX[1] < *in_RDI) {
    array_container_grow
              ((array_container_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,SUB21((ushort)in_stack_ffffffffffffffda >> 8,0));
  }
  if (*in_RSI == 0) {
    memmove(*(void **)(in_RDX + 2),*(void **)(in_RDI + 2),(long)*in_RDI << 1);
    *in_RDX = *in_RDI;
  }
  else {
    uVar4 = (uint)**(ushort **)(in_RSI + 2);
    uVar2 = uVar4 + *(ushort *)(*(long *)(in_RSI + 2) + 2);
    iVar3 = 0;
    local_2c = 0;
    for (local_30 = 0; local_30 < *in_RDI; local_30 = local_30 + 1) {
      uVar1 = *(ushort *)(*(long *)(in_RDI + 2) + (long)local_30 * 2);
      if (uVar1 < uVar4) {
        *(ushort *)(*(long *)(in_RDX + 2) + (long)local_2c * 2) = uVar1;
        local_2c = local_2c + 1;
      }
      else if (uVar2 < uVar1) {
        do {
          if (iVar3 + 1 < *in_RSI) {
            iVar3 = iVar3 + 1;
            uVar4 = (uint)*(ushort *)(*(long *)(in_RSI + 2) + (long)iVar3 * 4);
            uVar2 = uVar4 + *(ushort *)(*(long *)(in_RSI + 2) + 2 + (long)iVar3 * 4);
          }
          else {
            uVar2 = 0x10001;
            uVar4 = 0x10001;
          }
        } while (uVar2 < uVar1);
        local_30 = local_30 + -1;
      }
    }
    *in_RDX = local_2c;
  }
  return;
}

Assistant:

void array_run_container_andnot(const array_container_t *src_1,
                                const run_container_t *src_2,
                                array_container_t *dst) {
    // basically following Java impl as of June 2016
    if (src_1->cardinality > dst->capacity) {
        array_container_grow(dst, src_1->cardinality, false);
    }

    if (src_2->n_runs == 0) {
        memmove(dst->array, src_1->array,
                sizeof(uint16_t) * src_1->cardinality);
        dst->cardinality = src_1->cardinality;
        return;
    }
    int32_t run_start = src_2->runs[0].value;
    int32_t run_end = run_start + src_2->runs[0].length;
    int which_run = 0;

    uint16_t val = 0;
    int dest_card = 0;
    for (int i = 0; i < src_1->cardinality; ++i) {
        val = src_1->array[i];
        if (val < run_start)
            dst->array[dest_card++] = val;
        else if (val <= run_end) {
            ;  // omitted item
        } else {
            do {
                if (which_run + 1 < src_2->n_runs) {
                    ++which_run;
                    run_start = src_2->runs[which_run].value;
                    run_end = run_start + src_2->runs[which_run].length;

                } else
                    run_start = run_end = (1 << 16) + 1;
            } while (val > run_end);
            --i;
        }
    }
    dst->cardinality = dest_card;
}